

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshConnected.cpp
# Opt level: O3

void __thiscall
chrono::geometry::ChTriangleMeshConnected::RefineMeshEdges
          (ChTriangleMeshConnected *this,vector<int,_std::allocator<int>_> *marked_tris,
          double edge_maxlen,ChRefineEdgeCriterion *criterion,
          vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *atri_map,
          vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
          *aux_data_double,
          vector<std::vector<int,_std::allocator<int>_>_*,_std::allocator<std::vector<int,_std::allocator<int>_>_*>_>
          *aux_data_int,
          vector<std::vector<bool,_std::allocator<bool>_>_*,_std::allocator<std::vector<bool,_std::allocator<bool>_>_*>_>
          *aux_data_bool,
          vector<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_*,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_*>_>
          *aux_data_vect)

{
  undefined4 uVar1;
  int iVar2;
  int *piVar3;
  ChGeometry CVar4;
  double dVar5;
  int iVar6;
  int *piVar7;
  _List_node_base *p_Var8;
  pair<int,_int> pVar9;
  long lVar10;
  ChTriangleMeshConnected *pCVar11;
  long lVar12;
  ChException *this_00;
  int iVar13;
  pointer piVar14;
  ChGeometry CVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  pointer pCVar20;
  pointer pCVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int itA_2;
  int itA_1;
  vector<int,_std::allocator<int>_> new_marked_tris;
  ChGeometry local_120;
  ChTriangleMeshConnected *local_118;
  pointer local_110;
  int local_104;
  int itB_2;
  int itB_1;
  pointer local_f8;
  list<int,_std::allocator<int>_> S;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> tmp_tri_map;
  vector<bool,_std::allocator<bool>_> local_a8;
  vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
  *local_80;
  vector<std::vector<int,_std::allocator<int>_>_*,_std::allocator<std::vector<int,_std::allocator<int>_>_*>_>
  *local_78;
  pointer local_70;
  vector<int,_std::allocator<int>_> *local_68;
  _List_node_base *local_60;
  pointer local_58;
  string local_50;
  
  local_80 = aux_data_double;
  local_78 = aux_data_int;
  std::__cxx11::list<int,std::allocator<int>>::
  list<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
            ((list<int,std::allocator<int>> *)&S,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             (marked_tris->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             (marked_tris->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish,(allocator_type *)&local_a8);
  tmp_tri_map.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tmp_tri_map.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tmp_tri_map.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (atri_map == (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)0x0) {
    ComputeNeighbouringTriangleMap(this,&tmp_tri_map);
  }
  else {
    std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::operator=
              (&tmp_tri_map,atri_map);
  }
  local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  std::vector<bool,_std::allocator<bool>_>::resize
            (&local_a8,
             ((long)(this->m_face_v_indices).
                    super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_face_v_indices).
                    super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555,false);
  piVar3 = (marked_tris->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar7 = (marked_tris->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start; piVar7 != piVar3; piVar7 = piVar7 + 1) {
    iVar13 = *piVar7;
    uVar16 = (ulong)iVar13;
    iVar2 = iVar13 + 0x3f;
    if (-1 < (long)uVar16) {
      iVar2 = iVar13;
    }
    *(ulong *)((int *)local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
              (long)(iVar2 >> 6) * 2 +
              (ulong)((uVar16 & 0x800000000000003f) < 0x8000000000000001) * 2 + -2) =
         *(ulong *)((int *)local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                   (long)(iVar2 >> 6) * 2 +
                   (ulong)((uVar16 & 0x800000000000003f) < 0x8000000000000001) * 2 + -2) |
         1L << (uVar16 & 0x3f);
  }
  new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  p_Var8 = S.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
           _M_next;
  local_68 = marked_tris;
  if (S.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_next !=
      (_List_node_base *)&S) {
    do {
      local_120._vptr_ChGeometry = (_func_int **)&local_120;
      uVar1 = *(undefined4 *)&p_Var8[1]._M_next;
      local_110 = (pointer)0x0;
      local_118 = (ChTriangleMeshConnected *)local_120._vptr_ChGeometry;
      local_60 = p_Var8;
      p_Var8 = (_List_node_base *)::operator_new(0x18);
      *(undefined4 *)&p_Var8[1]._M_next = uVar1;
      std::__detail::_List_node_base::_M_hook(p_Var8);
      local_110 = (pointer)((long)local_110->m_data + 1);
LAB_0080b1ef:
      if ((ChGeometry *)local_120._vptr_ChGeometry != &local_120) {
        local_104 = 0;
        iVar2 = 0;
        local_f8 = (pointer)0x0;
        iVar13 = *(int *)&(local_118->m_vertices).
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
        piVar14 = (pointer)(long)iVar13;
        CVar15._vptr_ChGeometry = local_120._vptr_ChGeometry;
        lVar12 = 0;
        do {
          pVar9 = GetTriangleEdgeIndexes
                            ((ChTriangleMeshConnected *)CVar15._vptr_ChGeometry,
                             (this->m_face_v_indices).
                             super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + (long)piVar14,(int)lVar12,
                             true);
          iVar6 = pVar9.first;
          if (criterion == (ChRefineEdgeCriterion *)0x0) {
            pCVar20 = (this->m_vertices).
                      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar10 = (long)pVar9 >> 0x20;
            dVar5 = pCVar20[iVar6].m_data[1] - pCVar20[lVar10].m_data[1];
            auVar22._8_8_ = 0;
            auVar22._0_8_ = pCVar20[iVar6].m_data[0] - pCVar20[lVar10].m_data[0];
            auVar24._8_8_ = 0;
            auVar24._0_8_ = dVar5 * dVar5;
            auVar22 = vfmadd231sd_fma(auVar24,auVar22,auVar22);
            auVar26._8_8_ = 0;
            auVar26._0_8_ = pCVar20[iVar6].m_data[2] - pCVar20[lVar10].m_data[2];
            auVar22 = vfmadd231sd_fma(auVar22,auVar26,auVar26);
            auVar22 = vsqrtsd_avx(auVar22,auVar22);
            pCVar20 = auVar22._0_8_;
          }
          else {
            CVar15._vptr_ChGeometry = (_func_int **)criterion;
            pCVar20 = (pointer)(**(code **)(*(long *)criterion + 0x10))
                                         (criterion,(ulong)pVar9 & 0xffffffff,(ulong)pVar9 >> 0x20,
                                          this);
          }
          pCVar11 = local_118;
          if ((double)local_f8 < (double)pCVar20) {
            iVar2 = tmp_tri_map.
                    super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[(long)piVar14]._M_elems[lVar12 + 1];
            local_104 = (int)lVar12;
            local_f8 = pCVar20;
          }
          bVar19 = lVar12 != 2;
          lVar12 = lVar12 + 1;
        } while (bVar19);
        if (edge_maxlen <= (double)local_f8) {
          pCVar11 = (ChTriangleMeshConnected *)::operator_new(0x18);
          *(int *)&(pCVar11->m_vertices).
                   super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish = iVar2;
          std::__detail::_List_node_base::_M_hook((_List_node_base *)pCVar11);
          pCVar20 = (pointer)((long)local_110->m_data + 1);
          if ((pointer)0x3e8 < pCVar20) {
            local_110 = pCVar20;
            this_00 = (ChException *)__cxa_allocate_exception(0x28);
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_50,"overflow in ChTriangleMeshConnected::RefineMeshEdges",""
                      );
            ChException::ChException(this_00,&local_50);
            __cxa_throw(this_00,&ChException::typeinfo,ChException::~ChException);
          }
          if (iVar2 != -1) goto code_r0x0080b34f;
          if (edge_maxlen < (double)local_f8) {
            local_110 = pCVar20;
            SplitEdge(this,iVar13,-1,local_104,0,&itA_1,&itA_2,&itB_1,&itB_2,&tmp_tri_map,local_80,
                      local_78,aux_data_bool,aux_data_vect);
            if (piVar14 < (pointer)((ulong)local_a8.super__Bvector_base<std::allocator<bool>_>.
                                           _M_impl.super__Bvector_impl_data._M_finish.
                                           super__Bit_iterator_base._M_offset +
                                   ((long)local_a8.super__Bvector_base<std::allocator<bool>_>.
                                          _M_impl.super__Bvector_impl_data._M_finish.
                                          super__Bit_iterator_base._M_p -
                                   (long)local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl
                                         .super__Bvector_impl_data._M_start.super__Bit_iterator_base
                                         ._M_p) * 8)) {
              iVar2 = iVar13 + 0x3f;
              if (-1 < iVar13) {
                iVar2 = iVar13;
              }
              if ((*(ulong *)((int *)local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                             + (long)(iVar2 >> 6) * 2 +
                               (ulong)(((ulong)piVar14 & 0x800000000000003f) < 0x8000000000000001) *
                               2 + -2) >> ((ulong)piVar14 & 0x3f) & 1) != 0) {
                if (new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&new_marked_tris,
                             (iterator)
                             new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish,&itA_1);
                }
                else {
                  *new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish = itA_1;
                  new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
                if (new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&new_marked_tris,
                             (iterator)
                             new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish,&itA_2);
                }
                else {
                  *new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish = itA_2;
                  new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
              }
            }
            local_110 = (pointer)((long)local_110[-1].m_data + 0x17);
          }
          goto LAB_0080b779;
        }
        local_110 = (pointer)((long)local_110[-1].m_data + 0x17);
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(pCVar11,0x18);
      }
      CVar15._vptr_ChGeometry = local_120._vptr_ChGeometry;
      while ((ChTriangleMeshConnected *)CVar15._vptr_ChGeometry !=
             (ChTriangleMeshConnected *)&local_120) {
        CVar4._vptr_ChGeometry =
             *(_func_int ***)
              &((ChTriangleMeshConnected *)CVar15._vptr_ChGeometry)->super_ChTriangleMesh;
        operator_delete(CVar15._vptr_ChGeometry,0x18);
        CVar15._vptr_ChGeometry = CVar4._vptr_ChGeometry;
      }
      p_Var8 = (((_List_base<int,_std::allocator<int>_> *)&local_60->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next;
    } while (p_Var8 != (_List_node_base *)&S);
  }
  std::vector<int,_std::allocator<int>_>::operator=(local_68,&new_marked_tris);
  if (new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((pointer)local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p != (pointer)0x0) {
    operator_delete(local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (tmp_tri_map.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(tmp_tri_map.
                    super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)tmp_tri_map.
                          super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)tmp_tri_map.
                          super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  while (S.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_next
         != (_List_node_base *)&S) {
    p_Var8 = (((_List_base<int,_std::allocator<int>_> *)
              &(S.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
               _M_next)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(S.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                    super__List_node_base._M_next,0x18);
    S.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_next =
         p_Var8;
  }
  return;
code_r0x0080b34f:
  uVar17 = (ulong)iVar2;
  iVar13 = 0;
  uVar18 = 0;
  local_70 = (pointer)0x0;
  uVar16 = 0;
  local_110 = pCVar20;
  local_58 = piVar14;
  do {
    pVar9 = GetTriangleEdgeIndexes
                      (pCVar11,(this->m_face_v_indices).
                               super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar17,(int)uVar16,true);
    iVar6 = pVar9.first;
    if (criterion == (ChRefineEdgeCriterion *)0x0) {
      pCVar20 = (this->m_vertices).
                super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar12 = (long)pVar9 >> 0x20;
      dVar5 = pCVar20[iVar6].m_data[1] - pCVar20[lVar12].m_data[1];
      auVar23._8_8_ = 0;
      auVar23._0_8_ = pCVar20[iVar6].m_data[0] - pCVar20[lVar12].m_data[0];
      auVar25._8_8_ = 0;
      auVar25._0_8_ = dVar5 * dVar5;
      auVar22 = vfmadd231sd_fma(auVar25,auVar23,auVar23);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = pCVar20[iVar6].m_data[2] - pCVar20[lVar12].m_data[2];
      auVar22 = vfmadd231sd_fma(auVar22,auVar27,auVar27);
      auVar22 = vsqrtsd_avx(auVar22,auVar22);
      pCVar21 = auVar22._0_8_;
    }
    else {
      pCVar11 = (ChTriangleMeshConnected *)criterion;
      pCVar21 = (pointer)(**(code **)(*(long *)criterion + 0x10))
                                   (criterion,(ulong)pVar9 & 0xffffffff,(ulong)pVar9 >> 0x20,this);
    }
    piVar14 = local_58;
    if ((double)local_70 < (double)pCVar21) {
      uVar18 = uVar16 & 0xffffffff;
      iVar13 = tmp_tri_map.
               super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar17]._M_elems[uVar16 + 1];
      local_70 = pCVar21;
    }
    bVar19 = uVar16 != 2;
    uVar16 = uVar16 + 1;
  } while (bVar19);
  iVar6 = (int)local_58;
  if (iVar13 == iVar6) {
    if (edge_maxlen < (double)local_f8) {
      SplitEdge(this,iVar6,iVar2,local_104,(int)uVar18,&itA_1,&itA_2,&itB_1,&itB_2,&tmp_tri_map,
                local_80,local_78,aux_data_bool,aux_data_vect);
      if (piVar14 < (pointer)((ulong)local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                     _M_offset +
                             ((long)local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p
                             - (long)local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                             ) * 8)) {
        iVar13 = iVar6 + 0x3f;
        if (-1 < iVar6) {
          iVar13 = iVar6;
        }
        if ((*(ulong *)((int *)local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                       (long)(iVar13 >> 6) * 2 +
                       (ulong)(((ulong)piVar14 & 0x800000000000003f) < 0x8000000000000001) * 2 + -2)
             >> ((ulong)piVar14 & 0x3f) & 1) != 0) {
          if (new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&new_marked_tris,
                       (iterator)
                       new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,&itA_1);
          }
          else {
            *new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish = itA_1;
            new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          if (new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&new_marked_tris,
                       (iterator)
                       new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,&itA_2);
          }
          else {
            *new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish = itA_2;
            new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
      }
      if (uVar17 < (ulong)local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                   ((long)local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                   (long)local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8) {
        iVar13 = iVar2 + 0x3f;
        if (-1 < iVar2) {
          iVar13 = iVar2;
        }
        if ((*(ulong *)((int *)local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                       (long)(iVar13 >> 6) * 2 +
                       (ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) * 2 + -2) >>
             (uVar17 & 0x3f) & 1) != 0) {
          if (new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&new_marked_tris,
                       (iterator)
                       new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,&itB_1);
          }
          else {
            *new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish = itB_1;
            new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          if (new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&new_marked_tris,
                       (iterator)
                       new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,&itB_2);
          }
          else {
            *new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish = itB_2;
            new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
      }
    }
    local_110 = (pointer)((long)local_110[-1].m_data + 0x17);
LAB_0080b779:
    pCVar11 = local_118;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(pCVar11,0x18);
    pCVar11 = local_118;
    local_110 = (pointer)((long)local_110[-1].m_data + 0x17);
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(pCVar11,0x18);
  }
  goto LAB_0080b1ef;
}

Assistant:

void ChTriangleMeshConnected::RefineMeshEdges(
    std::vector<int>&
        marked_tris,     ///< triangles to refine (aso surrounding triangles might be affected by refinements)
    double edge_maxlen,  ///< maximum length of edge (small values give higher resolution)
    ChRefineEdgeCriterion* criterion,  ///< criterion for computing lenght (or other merit function) of edge, if =0 uses
                                       ///< default (euclidean length)
    std::vector<std::array<int, 4>>* atri_map,  ///< triangle connectivity map: use and modify it. Optional. If =0,
                                                ///< creates a temporary one just for life span of function.
    std::vector<std::vector<double>*>& aux_data_double,  ///< auxiliary buffers to refine (assuming indexed as vertexes:
                                                         ///< each with same size as vertex buffer)
    std::vector<std::vector<int>*>& aux_data_int,  ///< auxiliary buffers to refine (assuming indexed as vertexes: each
                                                   ///< with same size as vertex buffer)
    std::vector<std::vector<bool>*>& aux_data_bool,  ///< auxiliary buffers to refine (assuming indexed as vertexes:
                                                     ///< each with same size as vertex buffer)
    std::vector<std::vector<ChVector<>>*>& aux_data_vect  ///< auxiliary buffers to refine (assuming indexed as
                                                          ///< vertexes: each with same size as vertex buffer)
) {
    // initialize the list of triangles to refine, copying from marked triangles:
    std::list<int> S(marked_tris.begin(), marked_tris.end());

    // compute the connectivity map between triangles:
    std::vector<std::array<int, 4>> tmp_tri_map;
    std::vector<std::array<int, 4>>& tri_map = tmp_tri_map;
    if (atri_map) {
        tri_map = *atri_map;
    } else {
        this->ComputeNeighbouringTriangleMap(tri_map);
    }

    std::vector<bool> marked_tris_flagged;
    marked_tris_flagged.resize(this->m_face_v_indices.size());
    for (auto i : marked_tris)
        marked_tris_flagged[i] = true;

    std::vector<int> new_marked_tris;

    for (auto t_0 : S) {
        // Insert-lepp-points

        std::list<int> mlist;
        mlist.push_back(t_0);

        while (!mlist.empty()) {
            //  find last triangle in ordered list
            auto t_N = mlist.back();

            //  find longest-edge neighbour
            int t_N1 = 0;
            double L_max = 0;
            int edge_N = 0;
            double L_e;
            for (int ie = 0; ie < 3; ++ie) {
                std::pair<int, int> ie_verts = this->GetTriangleEdgeIndexes(m_face_v_indices[t_N], ie, true);
                if (criterion)
                    L_e = criterion->ComputeLength(ie_verts.first, ie_verts.second, this);
                else
                    L_e = (this->m_vertices[ie_verts.first] - this->m_vertices[ie_verts.second]).Length();
                if (L_e > L_max) {
                    L_max = L_e;
                    edge_N = ie;
                    t_N1 = tri_map[t_N][1 + ie];  // neighbour triangle
                }
            }

            if (L_max < edge_maxlen) {
                //  GetLog() << "  already small triangle - pop it and break while " << "\n";
                mlist.pop_back();
                break;
            }

            // add longest-edge neighbour to the list
            mlist.push_back(t_N1);

            if (mlist.size() > 1000)
                throw ChException("overflow in ChTriangleMeshConnected::RefineMeshEdges");

            // if boundary edge: always terminal edge
            if (t_N1 == -1) {
                // split triangle edge
                if (L_max > edge_maxlen) {
                    // do edge split
                    int itA_1, itA_2, itB_1, itB_2;
                    SplitEdge(t_N, -1, edge_N, 0, itA_1, itA_2, itB_1, itB_2, tri_map, aux_data_double, aux_data_int,
                              aux_data_bool, aux_data_vect);

                    // prepare list of original triangles after split, for the next iteration of bisection
                    if (t_N < marked_tris_flagged.size() && marked_tris_flagged[t_N] == true) {
                        new_marked_tris.push_back(itA_1);
                        new_marked_tris.push_back(itA_2);
                    }
                }

                // remove from list
                mlist.pop_back();
                mlist.pop_back();

            } else {
                //  find longest-edge in neighboring triangle
                double T1_L_max = 0;
                int edge_N1 = 0;
                int t_shared = 0;
                for (int ie = 0; ie < 3; ++ie) {
                    std::pair<int, int> T1_ie_verts = this->GetTriangleEdgeIndexes(m_face_v_indices[t_N1], ie, true);
                    if (criterion)
                        L_e = criterion->ComputeLength(T1_ie_verts.first, T1_ie_verts.second, this);
                    else
                        L_e = (this->m_vertices[T1_ie_verts.first] - this->m_vertices[T1_ie_verts.second]).Length();
                    if (L_e > T1_L_max) {
                        T1_L_max = L_e;
                        edge_N1 = ie;
                        t_shared = tri_map[t_N1][1 + ie];  // neighbour triangle
                    }
                }
                // shared terminal edge (it is the longest edge in both triangles)
                if (t_shared == t_N) {
                    // split triangle edge
                    if (L_max > edge_maxlen) {
                        // do edge split
                        int itA_1, itA_2, itB_1, itB_2;
                        SplitEdge(t_N, t_N1, edge_N, edge_N1, itA_1, itA_2, itB_1, itB_2, tri_map, aux_data_double,
                                  aux_data_int, aux_data_bool, aux_data_vect);

                        // prepare list of original triangles after split, for the next iteration of bisection
                        if (t_N < marked_tris_flagged.size() && marked_tris_flagged[t_N] == true) {
                            new_marked_tris.push_back(itA_1);
                            new_marked_tris.push_back(itA_2);
                        }
                        if (t_N1 < marked_tris_flagged.size() && marked_tris_flagged[t_N1] == true) {
                            new_marked_tris.push_back(itB_1);
                            new_marked_tris.push_back(itB_2);
                        }
                    }

                    // remove from list
                    mlist.pop_back();
                    mlist.pop_back();
                }
            }
        }
    }
    marked_tris = new_marked_tris;
}